

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.h
# Opt level: O2

void __thiscall
gimage::HighDynamicRangeFusion<float>::add
          (HighDynamicRangeFusion<float> *this,Image<float,_gimage::PixelTraits<float>_> *image,
          float max_value,int id,uint64_t timestamp,bool replace_id)

{
  vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
  *this_00;
  int *piVar1;
  Image<float,_gimage::PixelTraits<float>_> *this_01;
  pointer psVar2;
  invalid_argument *this_02;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  shared_ptr<gimage::HighDynamicRangeFusionBase::Data> p;
  int id_local;
  uint64_t timestamp_local;
  
  psVar2 = (this->super_HighDynamicRangeFusionBase).list.
           super__Vector_base<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->super_HighDynamicRangeFusionBase).list.
                super__Vector_base<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2;
  id_local = id;
  timestamp_local = timestamp;
  if ((lVar3 != 0) &&
     (((piVar1 = *(int **)&(((psVar2->
                             super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->laplace).
                           super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
       , *(long *)(piVar1 + 2) != image->width || (*(long *)(piVar1 + 4) != image->height)) ||
      (*piVar1 != image->depth)))) {
    this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_02,"HighDynamicRangeFusion::add(): All images must have same size and depth");
    __cxa_throw(this_02,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (id < 0) {
    uVar4 = 0xffffffff;
    bVar7 = false;
  }
  else {
    uVar6 = 0;
    for (uVar5 = 0xffffffffffffffff;
        (uVar4 = (uint)uVar5, uVar6 < (ulong)(lVar3 >> 4) && ((int)uVar4 < 0));
        uVar5 = uVar5 & 0xffffffff) {
      if (((psVar2->
           super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>)
          ._M_ptr)->id == id) {
        uVar5 = uVar6;
      }
      uVar6 = uVar6 + 1;
      psVar2 = psVar2 + 1;
    }
    bVar7 = -1 < (int)uVar4;
    if (bVar7 && !replace_id) {
      return;
    }
  }
  this_00 = &(this->super_HighDynamicRangeFusionBase).list;
  std::make_shared<gimage::HighDynamicRangeFusionBase::Data,int&,unsigned_long&>
            ((int *)&p,(unsigned_long *)&id_local);
  if (bVar7) {
    std::__shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>::
    operator=(&(this_00->
               super__Vector_base<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
               )._M_impl.super__Vector_impl_data._M_start[uVar4].
               super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
              ,&p.
                super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
             );
  }
  else {
    std::
    vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
    ::push_back(this_00,&p);
  }
  createLaplacianPyramid<float>
            (&(p.
               super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->laplace,image);
  std::
  vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
  ::resize(&(p.
             super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->weight,
           ((long)((p.
                    super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->laplace).
                  super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)((p.
                   super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->laplace).
                 super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x38);
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (((p.
               super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->weight).
             super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,image->width,image->height,1);
  this_01 = ((p.
              super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->weight).
            super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (this->contrast == true) {
    HighDynamicRangeFusionBase::setContrastWeight
              (&this->super_HighDynamicRangeFusionBase,this_01,
               ((p.
                 super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->laplace).
               super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,max_value);
  }
  else {
    Image<float,_gimage::PixelTraits<float>_>::operator=(this_01,1.0);
  }
  if (this->well_exposedness == true) {
    mulWellExposednessWeight
              (this,((p.
                      super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->weight).
                    super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,image,max_value);
  }
  if ((this->saturation == true) && (1 < image->depth)) {
    mulSaturationWeight(this,((p.
                               super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->weight).
                             super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,image,max_value);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.
              super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void add(const Image<T> &image, float max_value=255, int id=-1, uint64_t timestamp=0,
      bool replace_id=true)
    {
      // check that image has same size and depth as previous images

      if (list.size() > 0 && (list[0]->laplace[0].getWidth() != image.getWidth() ||
          list[0]->laplace[0].getHeight() != image.getHeight() ||
          list[0]->laplace[0].getDepth() != image.getDepth()))
      {
        throw std::invalid_argument("HighDynamicRangeFusion::add(): All images must have same size and depth");
      }

      // find existing data set with the same id

      int k=-1;
      if (id >= 0)
      {
        for (size_t i=0; i<list.size() && k < 0; i++)
        {
          if (list[i]->id == id)
          {
            k=static_cast<int>(i);
          }
        }
      }

      if (k >= 0 && !replace_id)
      {
        return;
      }

      // add, replace or skip data set, depending on the id and replace_id

      std::shared_ptr<Data> p=std::make_shared<Data>(id, timestamp);

      if (k >= 0)
      {
        list[k]=p;
      }
      else
      {
        list.push_back(p);
      }

      // create Laplace pyramid from image

      createLaplacianPyramid(p->laplace, image);

      // compute weights for highest resolution

      p->weight.resize(p->laplace.size());
      p->weight[0].setSize(image.getWidth(), image.getHeight(), 1);

      // weight according to local contrast

      if (contrast)
      {
        setContrastWeight(p->weight[0], p->laplace[0], max_value);
      }
      else
      {
        p->weight[0]=1;
      }

      // weight according to exposedness, i.e. not under- or overexposed

      if (well_exposedness)
      {
        mulWellExposednessWeight(p->weight[0], image, max_value);
      }

      // if color image, weight according to saturation

      if (saturation && image.getDepth() > 1)
      {
        mulSaturationWeight(p->weight[0], image, max_value);
      }
    }